

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  Queue<unsigned_int> *this_00;
  ClauseAllocator *this_01;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  vec<unsigned_int,_int> *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int i;
  int local_3c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  if (this->n_touched != 0) {
    this_00 = &this->subsumption_queue;
    this_01 = &(this->super_Solver).ca;
    iVar7 = 0;
    while( true ) {
      iVar1 = (this->subsumption_queue).end;
      iVar5 = 0;
      iVar6 = (this->subsumption_queue).first;
      if (iVar1 < iVar6) {
        iVar5 = (this->subsumption_queue).buf.sz;
      }
      if ((iVar1 - iVar6) + iVar5 <= iVar7) break;
      puVar2 = Queue<unsigned_int>::operator[](this_00,iVar7);
      puVar2 = RegionAllocator<unsigned_int>::operator[](&this_01->ra,*puVar2);
      if ((*puVar2 & 3) == 0) {
        puVar2 = Queue<unsigned_int>::operator[](this_00,iVar7);
        puVar2 = RegionAllocator<unsigned_int>::operator[](&this_01->ra,*puVar2);
        *puVar2 = *puVar2 & 0xfffffffc | 2;
      }
      iVar7 = iVar7 + 1;
    }
    local_38 = &this->occurs;
    for (local_3c = 0; local_3c < (this->super_Solver).next_var; local_3c = local_3c + 1) {
      pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          local_3c);
      if (*pcVar3 != '\0') {
        pvVar4 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                 ::lookup(local_38,&local_3c);
        for (lVar8 = 0; lVar8 < pvVar4->sz; lVar8 = lVar8 + 1) {
          puVar2 = RegionAllocator<unsigned_int>::operator[](&this_01->ra,pvVar4->data[lVar8]);
          if ((*puVar2 & 3) == 0) {
            Queue<unsigned_int>::insert(this_00,pvVar4->data[lVar8]);
            puVar2 = RegionAllocator<unsigned_int>::operator[](&this_01->ra,pvVar4->data[lVar8]);
            *puVar2 = *puVar2 & 0xfffffffc | 2;
          }
        }
        pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            local_3c);
        *pcVar3 = '\0';
      }
    }
    local_3c = 0;
    while( true ) {
      iVar7 = (this->subsumption_queue).end;
      iVar6 = 0;
      iVar1 = (this->subsumption_queue).first;
      if (iVar7 < iVar1) {
        iVar6 = (this->subsumption_queue).buf.sz;
      }
      if ((iVar7 - iVar1) + iVar6 <= local_3c) break;
      puVar2 = Queue<unsigned_int>::operator[](this_00,local_3c);
      puVar2 = RegionAllocator<unsigned_int>::operator[](&this_01->ra,*puVar2);
      if ((*puVar2 & 3) == 2) {
        puVar2 = Queue<unsigned_int>::operator[](this_00,local_3c);
        puVar2 = RegionAllocator<unsigned_int>::operator[](&this_01->ra,*puVar2);
        *(byte *)puVar2 = (byte)*puVar2 & 0xfc;
      }
      local_3c = local_3c + 1;
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}